

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dvbSubStreamReader.cpp
# Opt level: O0

int __thiscall
DVBSubStreamReader::decodeFrame
          (DVBSubStreamReader *this,uint8_t *buff,uint8_t *end,int *skipBytes,int *skipBeforeBytes)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int nextRez;
  int64_t currentTime;
  int rez;
  int *skipBeforeBytes_local;
  int *skipBytes_local;
  uint8_t *end_local;
  uint8_t *buff_local;
  DVBSubStreamReader *this_local;
  
  *skipBytes = 0;
  *skipBeforeBytes = 0;
  iVar2 = intDecodeFrame(this,buff,end);
  if (0 < iVar2) {
    lVar1 = this->m_start_display_time;
    iVar3 = intDecodeFrame(this,buff + iVar2,end);
    if (0 < iVar3) {
      this->m_frameDuration = this->m_start_display_time - lVar1;
    }
  }
  return iVar2;
}

Assistant:

int DVBSubStreamReader::decodeFrame(uint8_t* buff, uint8_t* end, int& skipBytes, int& skipBeforeBytes)
{
    skipBytes = 0;
    skipBeforeBytes = 0;
    const int rez = intDecodeFrame(buff, end);
    if (rez <= 0)
        return rez;
    const int64_t currentTime = m_start_display_time;
    const int nextRez = intDecodeFrame(buff + rez, end);
    if (nextRez <= 0)
        return rez;
    m_frameDuration = m_start_display_time - currentTime;
    return rez;
}